

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# horz_superres_test.cc
# Opt level: O1

void __thiscall
anon_unknown.dwarf_18a4c97::HorzSuperresQThreshEndToEndTest_HorzSuperresQThreshEndToEndPSNRTest_Test
::TestBody(HorzSuperresQThreshEndToEndTest_HorzSuperresQThreshEndToEndPSNRTest_Test *this)

{
  uint uVar1;
  undefined8 *puVar2;
  _func_int ***ppp_Var3;
  bool bVar4;
  _Head_base<0UL,_libaom_test::VideoSource_*,_false> this_00;
  pointer *__ptr;
  SEARCH_METHODS *pSVar5;
  double psnr;
  AssertionResult gtest_ar;
  unique_ptr<libaom_test::VideoSource,_std::default_delete<libaom_test::VideoSource>_> video;
  AssertHelper local_68;
  AssertHelper local_60;
  AssertHelper local_58;
  undefined1 local_50 [16];
  undefined1 local_40 [16];
  _Head_base<0UL,_libaom_test::VideoSource_*,_false> local_30;
  
  local_30._M_head_impl = (VideoSource *)0x0;
  this_00._M_head_impl = (VideoSource *)operator_new(0xd8);
  std::__cxx11::string::string
            ((string *)local_50,
             (this->super_HorzSuperresQThreshEndToEndTest).test_video_param_.filename,
             (allocator *)&local_60);
  libaom_test::Y4mVideoSource::Y4mVideoSource
            ((Y4mVideoSource *)this_00._M_head_impl,(string *)local_50,0,
             (this->super_HorzSuperresQThreshEndToEndTest).test_video_param_.limit);
  if (local_30._M_head_impl != (VideoSource *)0x0) {
    ppp_Var3 = &(local_30._M_head_impl)->_vptr_VideoSource;
    local_30._M_head_impl = this_00._M_head_impl;
    (*(*ppp_Var3)[1])();
    this_00._M_head_impl = local_30._M_head_impl;
  }
  local_30._M_head_impl = this_00._M_head_impl;
  if ((undefined1 *)CONCAT71(local_50._1_7_,local_50[0]) != local_40) {
    operator_delete((undefined1 *)CONCAT71(local_50._1_7_,local_50[0]));
  }
  local_60.data_ = (AssertHelperData *)0x0;
  testing::internal::
  CmpHelperNE<std::unique_ptr<libaom_test::VideoSource,std::default_delete<libaom_test::VideoSource>>,decltype(nullptr)>
            ((internal *)local_50,"video","nullptr",
             (unique_ptr<libaom_test::VideoSource,_std::default_delete<libaom_test::VideoSource>_> *
             )&local_30,&local_60.data_);
  if (local_50[0] == (string)0x0) {
    testing::Message::Message((Message *)&local_60);
    if ((undefined8 *)CONCAT71(local_50._9_7_,local_50[8]) == (undefined8 *)0x0) {
      pSVar5 = "";
    }
    else {
      pSVar5 = *(SEARCH_METHODS **)CONCAT71(local_50._9_7_,local_50[8]);
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_68,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/horz_superres_test.cc"
               ,0x178,(char *)pSVar5);
    testing::internal::AssertHelper::operator=(&local_68,(Message *)&local_60);
    testing::internal::AssertHelper::~AssertHelper(&local_68);
    local_68.data_ = local_60.data_;
LAB_00681fe9:
    if (local_68.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_68.data_ + 8))();
    }
LAB_00681ff4:
    puVar2 = (undefined8 *)CONCAT71(local_50._9_7_,local_50[8]);
    if (puVar2 != (undefined8 *)0x0) {
      if ((undefined8 *)*puVar2 != puVar2 + 2) {
        operator_delete((undefined8 *)*puVar2);
      }
      operator_delete(puVar2);
    }
  }
  else {
    puVar2 = (undefined8 *)CONCAT71(local_50._9_7_,local_50[8]);
    if (puVar2 != (undefined8 *)0x0) {
      if ((undefined8 *)*puVar2 != puVar2 + 2) {
        operator_delete((undefined8 *)*puVar2);
      }
      operator_delete(puVar2);
    }
    bVar4 = testing::internal::AlwaysTrue();
    if (bVar4) {
      testing::internal::HasNewFatalFailureHelper::HasNewFatalFailureHelper
                ((HasNewFatalFailureHelper *)local_50);
      bVar4 = testing::internal::AlwaysTrue();
      if (bVar4) {
        (*(this->super_HorzSuperresQThreshEndToEndTest).super_EncoderTest._vptr_EncoderTest[2])
                  (&(this->super_HorzSuperresQThreshEndToEndTest).super_EncoderTest,
                   local_30._M_head_impl);
      }
      bVar4 = local_50[8];
      testing::internal::HasNewFatalFailureHelper::~HasNewFatalFailureHelper
                ((HasNewFatalFailureHelper *)local_50);
      if (bVar4 == false) {
        uVar1 = (this->super_HorzSuperresQThreshEndToEndTest).frame_count_;
        local_60.data_ = (AssertHelperData *)0x0;
        if (uVar1 != 0) {
          local_60.data_ =
               (AssertHelperData *)
               ((this->super_HorzSuperresQThreshEndToEndTest).psnr_ / (double)uVar1);
        }
        testing::internal::CmpHelperGT<double,double>
                  ((internal *)local_50,"psnr","test_video_param_.psnr_threshold",
                   (double *)&local_60,
                   &(this->super_HorzSuperresQThreshEndToEndTest).test_video_param_.psnr_threshold);
        if (local_50[0] == (string)0x0) {
          testing::Message::Message((Message *)&local_68);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&(local_68.data_)->line,"superres_mode_ = ",0x11);
          std::ostream::operator<<
                    (&(local_68.data_)->line,
                     (this->super_HorzSuperresQThreshEndToEndTest).superres_mode_);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&(local_68.data_)->line,", superres_qthresh_ = ",0x16);
          std::ostream::operator<<
                    (&(local_68.data_)->line,
                     (this->super_HorzSuperresQThreshEndToEndTest).superres_qthresh_);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&(local_68.data_)->line,", superres_kf_qthresh_ = ",0x19);
          std::ostream::operator<<
                    (&(local_68.data_)->line,
                     (this->super_HorzSuperresQThreshEndToEndTest).superres_kf_qthresh_);
          if ((undefined8 *)CONCAT71(local_50._9_7_,local_50[8]) == (undefined8 *)0x0) {
            pSVar5 = "";
          }
          else {
            pSVar5 = *(SEARCH_METHODS **)CONCAT71(local_50._9_7_,local_50[8]);
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_58,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/horz_superres_test.cc"
                     ,0x17c,(char *)pSVar5);
          testing::internal::AssertHelper::operator=(&local_58,(Message *)&local_68);
          testing::internal::AssertHelper::~AssertHelper(&local_58);
          if (local_68.data_ != (AssertHelperData *)0x0) {
            (**(code **)(*(long *)local_68.data_ + 8))();
          }
        }
        puVar2 = (undefined8 *)CONCAT71(local_50._9_7_,local_50[8]);
        if (puVar2 != (undefined8 *)0x0) {
          if ((undefined8 *)*puVar2 != puVar2 + 2) {
            operator_delete((undefined8 *)*puVar2);
          }
          operator_delete(puVar2);
        }
        testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
                  ((internal *)local_50,"test_video_param_.limit","frame_count_",
                   &(this->super_HorzSuperresQThreshEndToEndTest).test_video_param_.limit,
                   &(this->super_HorzSuperresQThreshEndToEndTest).frame_count_);
        if (local_50[0] == (string)0x0) {
          testing::Message::Message((Message *)&local_68);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&(local_68.data_)->line,"superres_mode_ = ",0x11);
          std::ostream::operator<<
                    (&(local_68.data_)->line,
                     (this->super_HorzSuperresQThreshEndToEndTest).superres_mode_);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&(local_68.data_)->line,", superres_qthresh_ = ",0x16);
          std::ostream::operator<<
                    (&(local_68.data_)->line,
                     (this->super_HorzSuperresQThreshEndToEndTest).superres_qthresh_);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&(local_68.data_)->line,", superres_kf_qthresh_ = ",0x19);
          std::ostream::operator<<
                    (&(local_68.data_)->line,
                     (this->super_HorzSuperresQThreshEndToEndTest).superres_kf_qthresh_);
          if ((undefined8 *)CONCAT71(local_50._9_7_,local_50[8]) == (undefined8 *)0x0) {
            pSVar5 = "";
          }
          else {
            pSVar5 = *(SEARCH_METHODS **)CONCAT71(local_50._9_7_,local_50[8]);
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_58,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/horz_superres_test.cc"
                     ,0x181,(char *)pSVar5);
          testing::internal::AssertHelper::operator=(&local_58,(Message *)&local_68);
          testing::internal::AssertHelper::~AssertHelper(&local_58);
          goto LAB_00681fe9;
        }
        goto LAB_00681ff4;
      }
    }
    testing::Message::Message((Message *)local_50);
    testing::internal::AssertHelper::AssertHelper
              (&local_60,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/horz_superres_test.cc"
               ,0x17a,
               "Expected: RunLoop(video.get()) doesn\'t generate new fatal failures in the current thread.\n  Actual: it does."
              );
    testing::internal::AssertHelper::operator=(&local_60,(Message *)local_50);
    testing::internal::AssertHelper::~AssertHelper(&local_60);
    if ((long *)CONCAT71(local_50._1_7_,local_50[0]) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(local_50._1_7_,local_50[0]) + 8))();
    }
  }
  if ((Y4mVideoSource *)local_30._M_head_impl != (Y4mVideoSource *)0x0) {
    (*((VideoSource *)&(local_30._M_head_impl)->_vptr_VideoSource)->_vptr_VideoSource[1])();
  }
  return;
}

Assistant:

TEST_P(HorzSuperresQThreshEndToEndTest, HorzSuperresQThreshEndToEndPSNRTest) {
  DoTest();
}